

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O1

int run_test_fs_write_alotof_bufs_with_offset(void)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int extraout_EAX;
  uv_loop_t *puVar4;
  uv_loop_t *puVar5;
  char *__ptr;
  int in_EDI;
  char *pcVar6;
  ulong uVar7;
  long lVar8;
  uv_buf_t uVar9;
  char acStack_5a [2];
  uv_loop_t *puStack_58;
  
  fs_write_alotof_bufs_with_offset(in_EDI);
  fs_write_alotof_bufs_with_offset(in_EDI);
  puVar4 = uv_default_loop();
  uv_walk(puVar4,close_walk_cb,(void *)0x0);
  uv_run(puVar4,UV_RUN_DEFAULT);
  puVar5 = uv_default_loop();
  iVar2 = uv_loop_close(puVar5);
  if (iVar2 == 0) {
    return 0;
  }
  run_test_fs_write_alotof_bufs_with_offset_cold_1();
  puStack_58 = (uv_loop_t *)0x1563bd;
  unlink("test_file");
  puStack_58 = (uv_loop_t *)0x1563c2;
  loop = uv_default_loop();
  puStack_58 = (uv_loop_t *)0x1563d3;
  puVar5 = (uv_loop_t *)malloc(0xd4310);
  if (puVar5 == (uv_loop_t *)0x0) {
LAB_0015671f:
    puVar5 = puVar4;
    puStack_58 = (uv_loop_t *)0x156724;
    fs_write_alotof_bufs_with_offset_cold_17();
LAB_00156724:
    puStack_58 = (uv_loop_t *)0x156729;
    fs_write_alotof_bufs_with_offset_cold_1();
LAB_00156729:
    puStack_58 = (uv_loop_t *)0x15672e;
    fs_write_alotof_bufs_with_offset_cold_2();
LAB_0015672e:
    puStack_58 = (uv_loop_t *)0x156733;
    fs_write_alotof_bufs_with_offset_cold_3();
LAB_00156733:
    puStack_58 = (uv_loop_t *)0x156738;
    fs_write_alotof_bufs_with_offset_cold_4();
LAB_00156738:
    puStack_58 = (uv_loop_t *)0x15673d;
    fs_write_alotof_bufs_with_offset_cold_5();
LAB_0015673d:
    puStack_58 = (uv_loop_t *)0x156742;
    fs_write_alotof_bufs_with_offset_cold_6();
LAB_00156742:
    puStack_58 = (uv_loop_t *)0x156747;
    fs_write_alotof_bufs_with_offset_cold_16();
LAB_00156747:
    puStack_58 = (uv_loop_t *)0x15674c;
    fs_write_alotof_bufs_with_offset_cold_7();
LAB_0015674c:
    puStack_58 = (uv_loop_t *)0x156751;
    fs_write_alotof_bufs_with_offset_cold_8();
LAB_00156751:
    puStack_58 = (uv_loop_t *)0x156756;
    fs_write_alotof_bufs_with_offset_cold_10();
LAB_00156756:
    puStack_58 = (uv_loop_t *)0x15675b;
    fs_write_alotof_bufs_with_offset_cold_11();
LAB_0015675b:
    puStack_58 = (uv_loop_t *)0x156760;
    fs_write_alotof_bufs_with_offset_cold_12();
LAB_00156760:
    puStack_58 = (uv_loop_t *)0x156765;
    fs_write_alotof_bufs_with_offset_cold_13();
LAB_00156765:
    puStack_58 = (uv_loop_t *)0x15676a;
    fs_write_alotof_bufs_with_offset_cold_14();
  }
  else {
    puStack_58 = (uv_loop_t *)0x156402;
    iVar2 = uv_fs_open((uv_loop_t *)0x0,&open_req1,"test_file",0x42,0x180,(uv_fs_cb)0x0);
    if (iVar2 < 0) goto LAB_00156724;
    if (open_req1.result._4_4_ < 0) goto LAB_00156729;
    puStack_58 = (uv_loop_t *)0x156424;
    uv_fs_req_cleanup(&open_req1);
    puStack_58 = (uv_loop_t *)0x156435;
    iov = uv_buf_init("0123456789",10);
    puStack_58 = (uv_loop_t *)0x156473;
    iVar2 = uv_fs_write((uv_loop_t *)0x0,&write_req,(uv_file)open_req1.result,&iov,1,-1,
                        (uv_fs_cb)0x0);
    if (iVar2 != 10) goto LAB_0015672e;
    if (write_req.result != 10) goto LAB_00156733;
    puStack_58 = (uv_loop_t *)0x156498;
    uv_fs_req_cleanup(&write_req);
    lVar8 = 8;
    do {
      puStack_58 = (uv_loop_t *)0x1564b2;
      uVar9 = uv_buf_init(test_buf,0xd);
      *(char **)((long)puVar5->handle_queue + lVar8 + -0x18) = uVar9.base;
      *(size_t *)((long)puVar5->handle_queue + lVar8 + -0x10) = uVar9.len;
      lVar8 = lVar8 + 0x10;
    } while (lVar8 != 0xd4318);
    puStack_58 = (uv_loop_t *)0x1564f3;
    iVar2 = uv_fs_write((uv_loop_t *)0x0,&write_req,(uv_file)open_req1.result,(uv_buf_t *)puVar5,
                        0xd431,10,(uv_fs_cb)0x0);
    if (iVar2 < 0) goto LAB_00156738;
    if (write_req.result != 0xac67d) goto LAB_0015673d;
    puStack_58 = (uv_loop_t *)0x156518;
    uv_fs_req_cleanup(&write_req);
    puStack_58 = (uv_loop_t *)0x156522;
    __ptr = (char *)malloc(0xac67d);
    if (__ptr == (char *)0x0) goto LAB_00156742;
    lVar8 = 8;
    pcVar6 = __ptr;
    do {
      puStack_58 = (uv_loop_t *)0x156544;
      uVar9 = uv_buf_init(pcVar6,0xd);
      *(char **)((long)puVar5->handle_queue + lVar8 + -0x18) = uVar9.base;
      *(size_t *)((long)puVar5->handle_queue + lVar8 + -0x10) = uVar9.len;
      lVar8 = lVar8 + 0x10;
      pcVar6 = pcVar6 + 0xd;
    } while (lVar8 != 0xd4318);
    puStack_58 = (uv_loop_t *)0x156586;
    iVar2 = uv_fs_read((uv_loop_t *)0x0,&read_req,(uv_file)open_req1.result,(uv_buf_t *)puVar5,
                       0xd431,10,(uv_fs_cb)0x0);
    if (iVar2 < 0) goto LAB_00156747;
    lVar8 = 0xd;
    if (iVar2 != 0xd) {
      lVar8 = 0x3400;
    }
    if (read_req.result != lVar8) goto LAB_0015674c;
    pcVar6 = __ptr;
    uVar7 = 0;
    do {
      puStack_58 = (uv_loop_t *)0x1565d0;
      iVar3 = strncmp(pcVar6,test_buf,0xd);
      if (iVar3 != 0) {
        puStack_58 = (uv_loop_t *)0x15671f;
        fs_write_alotof_bufs_with_offset_cold_9();
        puVar4 = puVar5;
        goto LAB_0015671f;
      }
      if (iVar2 == 0xd) break;
      pcVar6 = pcVar6 + 0xd;
      bVar1 = uVar7 < 0x3ff;
      uVar7 = uVar7 + 1;
    } while (bVar1);
    puStack_58 = (uv_loop_t *)0x1565fd;
    uv_fs_req_cleanup(&read_req);
    puStack_58 = (uv_loop_t *)0x156605;
    free(__ptr);
    puStack_58 = (uv_loop_t *)0x15661c;
    iVar2 = uv_fs_stat((uv_loop_t *)0x0,&stat_req,"test_file",(uv_fs_cb)0x0);
    if (iVar2 != 0) goto LAB_00156751;
    if (*(long *)((long)stat_req.ptr + 0x38) != write_req.result + 10) goto LAB_00156756;
    puStack_58 = (uv_loop_t *)0x156650;
    uv_fs_req_cleanup(&stat_req);
    puStack_58 = (uv_loop_t *)0x156661;
    uVar9 = uv_buf_init(buf,0x20);
    puStack_58 = (uv_loop_t *)0x1566a2;
    iov = uVar9;
    iVar2 = uv_fs_read((uv_loop_t *)0x0,&read_req,(uv_file)open_req1.result,&iov,1,
                       write_req.result + 10,(uv_fs_cb)0x0);
    if (iVar2 != 0) goto LAB_0015675b;
    if (read_req.result != 0) goto LAB_00156760;
    puStack_58 = (uv_loop_t *)0x1566c4;
    uv_fs_req_cleanup(&read_req);
    puStack_58 = (uv_loop_t *)0x1566da;
    iVar2 = uv_fs_close((uv_loop_t *)0x0,&close_req,(uv_file)open_req1.result,(uv_fs_cb)0x0);
    if (iVar2 != 0) goto LAB_00156765;
    if (close_req.result == 0) {
      puStack_58 = (uv_loop_t *)0x1566f8;
      uv_fs_req_cleanup(&close_req);
      puStack_58 = (uv_loop_t *)0x156704;
      unlink("test_file");
      free(puVar5);
      return extraout_EAX;
    }
  }
  puStack_58 = (uv_loop_t *)run_test_fs_read_dir;
  fs_write_alotof_bufs_with_offset_cold_15();
  puStack_58 = puVar5;
  loop = uv_default_loop();
  rmdir("test_dir");
  iVar2 = uv_fs_mkdir(loop,&mkdir_req,"test_dir",0x1ed,mkdir_cb);
  if (iVar2 == 0) {
    uv_run(loop,UV_RUN_DEFAULT);
    if (mkdir_cb_count != 1) goto LAB_001568e1;
    iVar2 = uv_fs_open(loop,&open_req1,"test_dir",0x10000,0x180,(uv_fs_cb)0x0);
    if (iVar2 < 0) goto LAB_001568e6;
    uv_fs_req_cleanup(&open_req1);
    uVar9 = uv_buf_init(acStack_5a,2);
    iov = uVar9;
    iVar2 = uv_fs_read((uv_loop_t *)0x0,&read_req,(uv_file)open_req1.result,&iov,1,0,(uv_fs_cb)0x0);
    if (iVar2 != -0x15) goto LAB_001568eb;
    uv_fs_req_cleanup(&read_req);
    iVar2 = uv_fs_close((uv_loop_t *)0x0,&close_req,(uv_file)open_req1.result,(uv_fs_cb)0x0);
    if (iVar2 == 0) {
      uv_fs_req_cleanup(&close_req);
      rmdir("test_dir");
      puVar4 = uv_default_loop();
      uv_walk(puVar4,close_walk_cb,(void *)0x0);
      uv_run(puVar4,UV_RUN_DEFAULT);
      puVar4 = uv_default_loop();
      iVar2 = uv_loop_close(puVar4);
      if (iVar2 == 0) {
        return 0;
      }
      goto LAB_001568f5;
    }
  }
  else {
    run_test_fs_read_dir_cold_1();
LAB_001568e1:
    run_test_fs_read_dir_cold_2();
LAB_001568e6:
    run_test_fs_read_dir_cold_3();
LAB_001568eb:
    run_test_fs_read_dir_cold_4();
  }
  run_test_fs_read_dir_cold_5();
LAB_001568f5:
  run_test_fs_read_dir_cold_6();
  test_fs_partial(1);
  return 0;
}

Assistant:

TEST_IMPL(fs_write_alotof_bufs_with_offset) {
  fs_write_alotof_bufs_with_offset(0);
  fs_write_alotof_bufs_with_offset(UV_FS_O_FILEMAP);

  MAKE_VALGRIND_HAPPY();
  return 0;
}